

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O3

void __thiscall miniros::TopicManager::getBusInfo(TopicManager *this,XmlRpcValue *info)

{
  pointer psVar1;
  Publication *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _List_node_base *p_Var3;
  Subscription *this_01;
  int iVar4;
  scoped_lock<std::mutex> lock;
  pointer psVar5;
  
  XmlRpc::XmlRpcValue::assertArray(info,0);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->advertised_topics_mutex_);
  if (iVar4 == 0) {
    psVar1 = (this->advertised_topics_).
             super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (this->advertised_topics_).
                  super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1)
    {
      this_00 = (psVar5->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      p_Var2 = (psVar5->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      Publication::getInfo(this_00,info);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->advertised_topics_mutex_);
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar4 == 0) {
      for (p_Var3 = (this->subscriptions_).
                    super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var3 != (_List_node_base *)&this->subscriptions_; p_Var3 = p_Var3->_M_next) {
        this_01 = (Subscription *)p_Var3[1]._M_next;
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[1]._M_prev;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        Subscription::getInfo(this_01,info);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void TopicManager::getBusInfo(XmlRpcValue& info)
{
  // force these guys to be arrays, even if we don't populate them
  info.setSize(0);

  {
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);
    for (PublicationPtr t: advertised_topics_) {
      t->getInfo(info);
    }
  }

  {
    std::scoped_lock<std::mutex> lock(subs_mutex_);
    for (SubscriptionPtr t: subscriptions_) {
      t->getInfo(info);
    }
  }
}